

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int luv_tcp_nodelay(lua_State *L)

{
  int on;
  uint status;
  uv_tcp_t *handle;
  int iVar1;
  int in_ESI;
  
  handle = luv_check_tcp(L,in_ESI);
  iVar1 = 1;
  luaL_checktype(L,2,1);
  on = lua_toboolean(L,2);
  status = uv_tcp_nodelay(handle,on);
  if ((int)status < 0) {
    luv_error(L,status);
    iVar1 = 3;
  }
  else {
    lua_pushinteger(L,(ulong)status);
  }
  return iVar1;
}

Assistant:

static int luv_tcp_nodelay(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  int ret, enable;
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  enable = lua_toboolean(L, 2);
  ret = uv_tcp_nodelay(handle, enable);
  return luv_result(L, ret);
}